

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O2

void def_symbol(c2m_ctx_t c2m_ctx,symbol_mode mode,node_t_conflict id,node_t_conflict scope,
               node_t_conflict def_node,node_code_t linkage)

{
  byte bVar1;
  byte bVar2;
  void *pvVar3;
  type *type1;
  type *type2;
  symbol_t el_00;
  uint uVar4;
  int iVar5;
  int iVar6;
  size_t sVar7;
  node_t_conflict pnVar8;
  undefined4 in_register_00000034;
  int iVar9;
  ulong ix;
  byte bVar10;
  pos_t pVar11;
  char *local_e0;
  VARR_node_t *local_98;
  symbol_t sym;
  symbol_t el;
  
  pnVar8 = (node_t_conflict)CONCAT44(in_register_00000034,mode);
  if (pnVar8->code == N_IGNORE) {
    return;
  }
  if ((id == (node_t_conflict)0x0) || (pnVar8->code != N_ID)) {
    __assert_fail("id->code == N_ID && scope != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                  ,0x1975,
                  "void def_symbol(c2m_ctx_t, enum symbol_mode, node_t, node_t, node_t, node_code_t)"
                 );
  }
  uVar4 = id->code - N_FOR;
  if ((0x36 < uVar4) || ((0x40100300000081U >> ((ulong)uVar4 & 0x3f) & 1) == 0)) {
    __assert_fail("scope->code == N_MODULE || scope->code == N_BLOCK || scope->code == N_STRUCT || scope->code == N_UNION || scope->code == N_FUNC || scope->code == N_FOR"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                  ,0x1977,
                  "void def_symbol(c2m_ctx_t, enum symbol_mode, node_t, node_t, node_t, node_code_t)"
                 );
  }
  pvVar3 = scope->attr;
  iVar9 = (int)def_node;
  bVar1 = *(byte *)((long)pvVar3 + 0x28);
  iVar6 = *(int *)((long)pvVar3 + 0x38);
  type1 = *(type **)((long)pvVar3 + 0x40);
  bVar10 = bVar1 >> 5 & 1;
  if ((bVar1 & 6) == 0 && bVar10 != 0) {
    pVar11 = get_node_pos(c2m_ctx,pnVar8);
    error(c2m_ctx,0x18cf15,pVar11.fname,pVar11._8_8_,(pnVar8->u).s.s);
  }
  iVar5 = symbol_find(c2m_ctx,S_REGULAR,pnVar8,id,&sym);
  if (iVar5 == 0) {
    symbol_insert(c2m_ctx,S_REGULAR,pnVar8,id,scope,(node_t_conflict)0x0);
    return;
  }
  if (scope->code != (sym.def_node)->code &&
      ((sym.def_node)->code == N_ENUM_CONST || scope->code == N_ENUM_CONST)) {
    pVar11 = get_node_pos(c2m_ctx,pnVar8);
    error(c2m_ctx,0x18cf39,pVar11.fname,pVar11._8_8_,(pnVar8->u).s.s);
    return;
  }
  type2 = *(type **)((long)(sym.def_node)->attr + 0x40);
  bVar2 = *(byte *)((long)(sym.def_node)->attr + 0x28);
  if (iVar9 == 0) {
    local_e0 = "repeated declaration %s";
    if ((((bVar1 & 1) != 0) && ((bVar2 & 1) != 0)) && (iVar5 = type_eq_p(type1,type2), iVar5 != 0))
    goto LAB_0015b0cf;
  }
  else {
    iVar5 = compatible_types_p(type1,type2,0);
    if (iVar5 != 0) goto LAB_0015b0cf;
    local_e0 = "incompatible types of %s declarations";
  }
  pVar11 = get_node_pos(c2m_ctx,pnVar8);
  error(c2m_ctx,local_e0,pVar11.fname,pVar11._8_8_,(pnVar8->u).s.s);
LAB_0015b0cf:
  if ((bVar2 >> 5 & 1) != bVar10) {
    pVar11 = get_node_pos(c2m_ctx,pnVar8);
    error(c2m_ctx,0x18cfa3,pVar11.fname,pVar11._8_8_,(pnVar8->u).s.s);
  }
  if ((iVar9 == 0x59 && iVar6 == 0x58) || (iVar9 == 0x58 && iVar6 == 0x59)) {
    pVar11 = get_node_pos(c2m_ctx,pnVar8);
    warning(c2m_ctx,0x18cfd8,pVar11.fname,pVar11._8_8_,(pnVar8->u).s.s);
  }
  VARR_node_tpush(sym.defs,scope);
  iVar6 = incomplete_type_p(c2m_ctx,type2);
  if (iVar6 != 0) {
    VARR_node_tcreate(&local_98,4);
    for (ix = 0; sVar7 = VARR_node_tlength(sym.defs), ix < sVar7; ix = ix + 1) {
      pnVar8 = VARR_node_tget(sym.defs,ix);
      VARR_node_tpush(local_98,pnVar8);
    }
    el_00.id = sym.id;
    el_00.mode = sym.mode;
    el_00._4_4_ = sym._4_4_;
    el_00.scope = sym.scope;
    el_00.def_node = scope;
    el_00.aux_node = sym.aux_node;
    el_00.defs = local_98;
    HTAB_symbol_t_do(c2m_ctx->symbol_tab,el_00,HTAB_REPLACE,&el);
  }
  return;
}

Assistant:

static void def_symbol (c2m_ctx_t c2m_ctx, enum symbol_mode mode, node_t id, node_t scope,
                        node_t def_node, node_code_t linkage) {
  symbol_t sym;
  struct decl_spec tab_decl_spec, decl_spec;

  if (id->code == N_IGNORE) return;
  assert (id->code == N_ID && scope != NULL);
  assert (scope->code == N_MODULE || scope->code == N_BLOCK || scope->code == N_STRUCT
          || scope->code == N_UNION || scope->code == N_FUNC || scope->code == N_FOR);
  decl_spec = ((decl_t) def_node->attr)->decl_spec;
  if (decl_spec.thread_local_p && !decl_spec.static_p && !decl_spec.extern_p)
    error (c2m_ctx, POS (id), "auto %s is declared as thread local", id->u.s.s);
  if (!symbol_find (c2m_ctx, mode, id, scope, &sym)) {
    symbol_insert (c2m_ctx, mode, id, scope, def_node, NULL);
    return;
  }
  tab_decl_spec = ((decl_t) sym.def_node->attr)->decl_spec;
  if ((def_node->code == N_ENUM_CONST || sym.def_node->code == N_ENUM_CONST)
      && def_node->code != sym.def_node->code) {
    error (c2m_ctx, POS (id), "%s redeclared as a different kind of symbol", id->u.s.s);
    return;
  } else if (linkage == N_IGNORE) {
    if (!decl_spec.typedef_p || !tab_decl_spec.typedef_p
        || !type_eq_p (decl_spec.type, tab_decl_spec.type))
#if defined(__APPLE__)
      /* a hack to use our definition instead of macosx for non-GNU compiler */
      if (strcmp (id->u.s.s, "__darwin_va_list") != 0)
#endif
        error (c2m_ctx, POS (id), "repeated declaration %s", id->u.s.s);
  } else if (!compatible_types_p (decl_spec.type, tab_decl_spec.type, FALSE)) {
    error (c2m_ctx, POS (id), "incompatible types of %s declarations", id->u.s.s);
  }
  if (tab_decl_spec.thread_local_p != decl_spec.thread_local_p) {
    error (c2m_ctx, POS (id), "thread local and non-thread local declarations of %s", id->u.s.s);
  }
  if ((decl_spec.linkage == N_EXTERN && linkage == N_STATIC)
      || (decl_spec.linkage == N_STATIC && linkage == N_EXTERN))
    warning (c2m_ctx, POS (id), "%s defined with external and internal linkage", id->u.s.s);
  VARR_PUSH (node_t, sym.defs, def_node);
  if (incomplete_type_p (c2m_ctx, tab_decl_spec.type)) symbol_def_replace (c2m_ctx, sym, def_node);
}